

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_client_write(Curl_easy *data,int type,char *buf,size_t blen)

{
  Curl_cwriter *pCVar1;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  ulong uVar4;
  
  if (((data->req).writer_stack != (Curl_cwriter *)0x0) ||
     (CVar3 = do_init_writer_stack(data), CVar3 == CURLE_OK)) {
    pCVar1 = (data->req).writer_stack;
    if (pCVar1 == (Curl_cwriter *)0x0) {
      uVar4 = 0x17;
    }
    else {
      CVar3 = (*pCVar1->cwt->do_write)(data,pCVar1,type,buf,blen);
      uVar4 = (ulong)CVar3;
    }
    CVar3 = (CURLcode)uVar4;
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < Curl_trc_feat_write.log_level)) {
      Curl_trc_write(data,"client_write(type=%x, len=%zu) -> %d",type,blen,uVar4);
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_client_write(struct Curl_easy *data,
                           int type, const char *buf, size_t blen)
{
  CURLcode result;

  /* it is one of those, at least */
  DEBUGASSERT(type & (CLIENTWRITE_BODY|CLIENTWRITE_HEADER|CLIENTWRITE_INFO));
  /* BODY is only BODY (with optional EOS) */
  DEBUGASSERT(!(type & CLIENTWRITE_BODY) ||
              ((type & ~(CLIENTWRITE_BODY|CLIENTWRITE_EOS)) == 0));
  /* INFO is only INFO (with optional EOS) */
  DEBUGASSERT(!(type & CLIENTWRITE_INFO) ||
              ((type & ~(CLIENTWRITE_INFO|CLIENTWRITE_EOS)) == 0));

  if(!data->req.writer_stack) {
    result = do_init_writer_stack(data);
    if(result)
      return result;
    DEBUGASSERT(data->req.writer_stack);
  }

  result = Curl_cwriter_write(data, data->req.writer_stack, type, buf, blen);
  CURL_TRC_WRITE(data, "client_write(type=%x, len=%zu) -> %d",
                 type, blen, result);
  return result;
}